

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

void Gia_ManAreDeriveCexSat(Gia_ManAre_t *p,Gia_StaAre_t *pCur,Gia_StaAre_t *pNext,int iOutFailed)

{
  Gia_PtrAre_t GVar1;
  lit *begin;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  sbyte sVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  int *piVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  Vec_Int_t *pVVar12;
  
  p->vAssumps->nSize = 0;
  pGVar4 = p->pAig;
  iVar3 = pGVar4->nRegs;
  if (0 < iVar3) {
    uVar9 = 0;
    iVar10 = 0;
    do {
      if (((uint)(&pCur[1].iPrev)[(int)uVar9 >> 5] >> (uVar9 & 0x1e) & 1) == 0) {
        if (((uint)(&pCur[1].iPrev)[(int)uVar9 >> 5] >> (sbyte)(uVar9 & 0x1e) & 2) != 0) {
          uVar2 = (pGVar4->vCis->nSize - iVar3) + iVar10;
          if ((-1 < (int)uVar2) && ((int)uVar2 < p->vSatNumCis->nSize)) {
            iVar3 = p->vSatNumCis->pArray[uVar2];
            if (-1 < iVar3) {
              pVVar6 = p->vAssumps;
              iVar3 = iVar3 * 2;
              goto LAB_0073e836;
            }
            goto LAB_0073ebb6;
          }
          goto LAB_0073eb78;
        }
      }
      else {
        uVar2 = (pGVar4->vCis->nSize - iVar3) + iVar10;
        if (((int)uVar2 < 0) || (p->vSatNumCis->nSize <= (int)uVar2)) goto LAB_0073eb78;
        iVar3 = p->vSatNumCis->pArray[uVar2];
        if (iVar3 < 0) goto LAB_0073ebb6;
        pVVar6 = p->vAssumps;
        iVar3 = iVar3 * 2 + 1;
LAB_0073e836:
        Vec_IntPush(pVVar6,iVar3);
      }
      iVar10 = iVar10 + 1;
      pGVar4 = p->pAig;
      iVar3 = pGVar4->nRegs;
      uVar9 = uVar9 + 2;
    } while (iVar10 < iVar3);
  }
  if ((pNext != (Gia_StaAre_t *)0x0) && (0 < iVar3)) {
    uVar9 = 0;
    iVar10 = 0;
    do {
      if (((uint)(&pNext[1].iPrev)[(int)uVar9 >> 5] >> (uVar9 & 0x1e) & 1) == 0) {
        if (((uint)(&pNext[1].iPrev)[(int)uVar9 >> 5] >> (sbyte)(uVar9 & 0x1e) & 2) != 0) {
          uVar2 = (pGVar4->vCos->nSize - iVar3) + iVar10;
          if ((-1 < (int)uVar2) && ((int)uVar2 < p->vSatNumCos->nSize)) {
            iVar3 = p->vSatNumCos->pArray[uVar2];
            if (-1 < iVar3) {
              pVVar6 = p->vAssumps;
              iVar3 = iVar3 * 2;
              goto LAB_0073e908;
            }
            goto LAB_0073ebb6;
          }
          goto LAB_0073eb78;
        }
      }
      else {
        uVar2 = (pGVar4->vCos->nSize - iVar3) + iVar10;
        if (((int)uVar2 < 0) || (p->vSatNumCos->nSize <= (int)uVar2)) goto LAB_0073eb78;
        iVar3 = p->vSatNumCos->pArray[uVar2];
        if (iVar3 < 0) goto LAB_0073ebb6;
        pVVar6 = p->vAssumps;
        iVar3 = iVar3 * 2 + 1;
LAB_0073e908:
        Vec_IntPush(pVVar6,iVar3);
      }
      iVar10 = iVar10 + 1;
      pGVar4 = p->pAig;
      iVar3 = pGVar4->nRegs;
      uVar9 = uVar9 + 2;
    } while (iVar10 < iVar3);
  }
  if (-1 < iOutFailed) {
    if (pGVar4->vCos->nSize - pGVar4->nRegs <= iOutFailed) {
      __assert_fail("iOutFailed < Gia_ManPoNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                    ,0x752,
                    "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                   );
    }
    if (p->vSatNumCos->nSize <= iOutFailed) {
LAB_0073eb78:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = p->vSatNumCos->pArray[(uint)iOutFailed];
    if (iVar3 < 0) {
LAB_0073ebb6:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(p->vAssumps,iVar3 * 2);
  }
  begin = p->vAssumps->pArray;
  iVar3 = sat_solver_solve((sat_solver *)p->pSat,begin,begin + p->vAssumps->nSize,1000000,0,0,0);
  if (iVar3 != 1) {
    puts("SAT problem is not satisfiable. Failure...");
    return;
  }
  p->vCofVars->nSize = 0;
  pGVar4 = p->pAig;
  uVar7 = (ulong)(uint)pGVar4->nRegs;
  pVVar6 = pGVar4->vCis;
  if (pGVar4->nRegs < pVVar6->nSize) {
    lVar11 = 0;
    do {
      if (p->vSatNumCis->nSize <= lVar11) goto LAB_0073eb78;
      iVar3 = p->vSatNumCis->pArray[lVar11];
      if (((long)iVar3 < 0) || (*p->pSat <= iVar3)) goto LAB_0073eb97;
      if (*(int *)(*(long *)((long)p->pSat + 0x148) + (long)iVar3 * 4) == 1) {
        Vec_IntPush(p->vCofVars,(int)lVar11);
        pGVar4 = p->pAig;
      }
      lVar11 = lVar11 + 1;
      uVar7 = (ulong)pGVar4->nRegs;
      pVVar6 = pGVar4->vCis;
    } while (lVar11 < (long)((long)pVVar6->nSize - uVar7));
  }
  if (0 < (int)uVar7) {
    uVar9 = 0;
    iVar3 = 0;
    do {
      GVar1 = (&pCur[1].iPrev)[(int)uVar9 >> 5];
      sVar5 = (sbyte)(uVar9 & 0x1e);
      if (((uint)GVar1 >> (uVar9 & 0x1e) & 1) == 0) {
        uVar2 = (pVVar6->nSize - (int)uVar7) + iVar3;
        piVar8 = (int *)p->pSat;
        pVVar12 = p->vSatNumCis;
        if (((uint)GVar1 >> sVar5 & 2) == 0) {
          if ((int)uVar2 < 0) goto LAB_0073eb78;
        }
        else {
          if (((int)uVar2 < 0) || (pVVar12->nSize <= (int)uVar2)) goto LAB_0073eb78;
          iVar10 = pVVar12->pArray[uVar2];
          if (((long)iVar10 < 0) || (*piVar8 <= iVar10)) {
LAB_0073eb97:
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (*(int *)(*(long *)(piVar8 + 0x52) + (long)iVar10 * 4) != 1) {
            __assert_fail("sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                          ,0x76b,
                          "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                         );
          }
        }
      }
      else {
        uVar2 = (pVVar6->nSize - (int)uVar7) + iVar3;
        if (((int)uVar2 < 0) || (pVVar12 = p->vSatNumCis, pVVar12->nSize <= (int)uVar2))
        goto LAB_0073eb78;
        iVar10 = pVVar12->pArray[uVar2];
        if (((long)iVar10 < 0) || (piVar8 = (int *)p->pSat, *piVar8 <= iVar10)) goto LAB_0073eb97;
        if (*(int *)(*(long *)(piVar8 + 0x52) + (long)iVar10 * 4) == 1) {
          __assert_fail("sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                        ,0x769,
                        "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                       );
        }
      }
      if (pVVar12->nSize <= (int)uVar2) goto LAB_0073eb78;
      iVar10 = pVVar12->pArray[uVar2];
      if (((long)iVar10 < 0) || (*piVar8 <= iVar10)) goto LAB_0073eb97;
      (&pCur[1].iPrev)[(int)uVar9 >> 5] =
           (Gia_PtrAre_t)
           ((*(int *)(*(long *)(piVar8 + 0x52) + (long)iVar10 * 4) == 1) + 1 << sVar5 | (uint)GVar1)
      ;
      iVar3 = iVar3 + 1;
      uVar7 = (ulong)(uint)pGVar4->nRegs;
      uVar9 = uVar9 + 2;
    } while (iVar3 < pGVar4->nRegs);
  }
  return;
}

Assistant:

void Gia_ManAreDeriveCexSat( Gia_ManAre_t * p, Gia_StaAre_t * pCur, Gia_StaAre_t * pNext, int iOutFailed )
{
    int i, status;
    // make assuptions
    Vec_IntClear( p->vAssumps );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pCur, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i), 1 ) );
        else if ( Gia_StaHasValue1(pCur, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i), 0 ) );
    }
    if ( pNext )
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pNext, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, Gia_ManPoNum(p->pAig)+i), 1 ) );
        else if ( Gia_StaHasValue1(pNext, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, Gia_ManPoNum(p->pAig)+i), 0 ) );
    }
    if ( iOutFailed >= 0 )
    {
        assert( iOutFailed < Gia_ManPoNum(p->pAig) );
        Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, iOutFailed), 0 ) );
    }
    // solve SAT
    status = sat_solver_solve( (sat_solver *)p->pSat, (int *)Vec_IntArray(p->vAssumps), (int *)Vec_IntArray(p->vAssumps) + Vec_IntSize(p->vAssumps), 
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_True )
    {
        printf( "SAT problem is not satisfiable. Failure...\n" );
        return;
    }
    assert( status == l_True );
    // check the model
    Vec_IntClear( p->vCofVars );
    for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
    {
        if ( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, i) ) )
            Vec_IntPush( p->vCofVars, i );
    }
    // write the current state
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pCur, i) )
            assert( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0 );
        else if ( Gia_StaHasValue1(pCur, i) )
            assert( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 1 );
        // set don't-care value
        if ( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0 )
            Gia_StaSetValue0( pCur, i );
        else
            Gia_StaSetValue1( pCur, i );
    }
}